

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

void __thiscall tt::detail::FixedBuffer<4000>::append(FixedBuffer<4000> *this,char *buf,size_t len)

{
  int iVar1;
  size_t len_local;
  char *buf_local;
  FixedBuffer<4000> *this_local;
  
  iVar1 = avail(this);
  if ((int)len < iVar1) {
    memcpy(this->m_cur,buf,len);
    this->m_cur = this->m_cur + len;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len){
		if(avail() > static_cast<int>(len)){   //如果当前空间足够就将数据复制进去， 这里有待实现， 如果空间不够的情况
			memcpy(m_cur,buf,len);
			m_cur += len;
		}
	}